

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O2

void dcopy(int n,double *dx,int incx,double *dy,int incy)

{
  undefined1 auVar1 [16];
  long lVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  bool bVar6;
  
  if (0 < n) {
    if (incy == 1 && incx == 1) {
      if ((int)((ulong)(uint)n % 7) != 0) {
        for (uVar4 = 0; (ulong)(uint)n % 7 != uVar4; uVar4 = uVar4 + 1) {
          dy[uVar4] = dx[uVar4];
        }
      }
      uVar4 = CONCAT44(0,n);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar4;
      lVar2 = SUB168(auVar1 / ZEXT816(7),0);
      for (; SUB164(auVar1 / ZEXT816(7),0) * -7 + (int)uVar4 < n; uVar4 = uVar4 + 7) {
        dy[lVar2 * -7 + uVar4] = dx[lVar2 * -7 + uVar4];
        dy[lVar2 * -7 + uVar4 + 1] = dx[lVar2 * -7 + uVar4 + 1];
        dy[lVar2 * -7 + uVar4 + 2] = dx[lVar2 * -7 + uVar4 + 2];
        dy[lVar2 * -7 + uVar4 + 3] = dx[lVar2 * -7 + uVar4 + 3];
        dy[lVar2 * -7 + uVar4 + 4] = dx[lVar2 * -7 + uVar4 + 4];
        dy[lVar2 * -7 + uVar4 + 5] = dx[lVar2 * -7 + uVar4 + 5];
        dy[lVar2 * -7 + uVar4 + 6] = dx[lVar2 * -7 + uVar4 + 6];
      }
    }
    else {
      pdVar3 = dy + (incy >> 0x1f & (1 - n) * incy);
      pdVar5 = dx + (incx >> 0x1f & (1 - n) * incx);
      while (bVar6 = n != 0, n = n + -1, bVar6) {
        *pdVar3 = *pdVar5;
        pdVar3 = pdVar3 + incy;
        pdVar5 = pdVar5 + incx;
      }
    }
  }
  return;
}

Assistant:

void dcopy ( int n, double dx[], int incx, double dy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    DCOPY copies a vector X to a vector Y.
//
//  Discussion:
//
//    The routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in DX and DY.
//
//    Input, double DX[*], the first vector.
//
//    Input, int INCX, the increment between successive entries of DX.
//
//    Output, double DY[*], the second vector.
//
//    Input, int INCY, the increment between successive entries of DY.
//
{
  int i;
  int ix;
  int iy;
  int m;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    m = n % 7;

    if ( m != 0 )
    {
      for ( i = 0; i < m; i++ )
      {
        dy[i] = dx[i];
      }
    }

    for ( i = m; i < n; i = i + 7 )
    {
      dy[i] = dx[i];
      dy[i + 1] = dx[i + 1];
      dy[i + 2] = dx[i + 2];
      dy[i + 3] = dx[i + 3];
      dy[i + 4] = dx[i + 4];
      dy[i + 5] = dx[i + 5];
      dy[i + 6] = dx[i + 6];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      dy[iy] = dx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }

  }

  return;
}